

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

bool __thiscall
llvm::yaml::Scanner::scanBlockScalarHeader
          (Scanner *this,char *ChompingIndicator,uint *IndentIndicator,bool *IsDone)

{
  iterator pcVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  iterator pcVar5;
  Twine local_c0;
  undefined1 local_98 [8];
  Token T;
  iterator Start;
  bool *IsDone_local;
  uint *IndentIndicator_local;
  char *ChompingIndicator_local;
  Scanner *this_local;
  
  pcVar1 = this->Current;
  cVar2 = scanBlockChompingIndicator(this);
  *ChompingIndicator = cVar2;
  uVar4 = scanBlockIndentationIndicator(this);
  *IndentIndicator = uVar4;
  if (*ChompingIndicator == ' ') {
    cVar2 = scanBlockChompingIndicator(this);
    *ChompingIndicator = cVar2;
  }
  T.Value.field_2._8_8_ = skip_s_white;
  pcVar5 = skip_while(this,0x21eb50,(iterator)0x0);
  this->Current = pcVar5;
  skipComment(this);
  if (this->Current == this->End) {
    Token::Token((Token *)local_98);
    local_98._0_4_ = TK_BlockScalar;
    T.Range.Data = this->Current + -(long)pcVar1;
    T._0_8_ = pcVar1;
    AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
    ::push_back(&this->TokenQueue,(Token *)local_98);
    *IsDone = true;
    this_local._7_1_ = true;
    Token::~Token((Token *)local_98);
  }
  else {
    bVar3 = consumeLineBreakIfPresent(this);
    if (bVar3) {
      this_local._7_1_ = true;
    }
    else {
      Twine::Twine(&local_c0,"Expected a line break after block scalar header");
      setError(this,&local_c0,this->Current);
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Scanner::scanBlockScalarHeader(char &ChompingIndicator,
                                    unsigned &IndentIndicator, bool &IsDone) {
  auto Start = Current;

  ChompingIndicator = scanBlockChompingIndicator();
  IndentIndicator = scanBlockIndentationIndicator();
  // Check for the chomping indicator once again.
  if (ChompingIndicator == ' ')
    ChompingIndicator = scanBlockChompingIndicator();
  Current = skip_while(&Scanner::skip_s_white, Current);
  skipComment();

  if (Current == End) { // EOF, we have an empty scalar.
    Token T;
    T.Kind = Token::TK_BlockScalar;
    T.Range = StringRef(Start, Current - Start);
    TokenQueue.push_back(T);
    IsDone = true;
    return true;
  }

  if (!consumeLineBreakIfPresent()) {
    setError("Expected a line break after block scalar header", Current);
    return false;
  }
  return true;
}